

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O2

mi_page_queue_t * mi_heap_page_queue_of(mi_heap_t *heap,mi_page_t *page)

{
  size_t sStack_10;
  
  if (((page->flags).full_aligned & 1) == 0) {
    if ((page->field_0x8 & 4) == 0) {
      sStack_10 = mi_bin(page->block_size);
    }
    else {
      sStack_10 = 0x49;
    }
  }
  else {
    sStack_10 = 0x4a;
  }
  return heap->pages + sStack_10;
}

Assistant:

static mi_page_queue_t* mi_heap_page_queue_of(mi_heap_t* heap, const mi_page_t* page) {
  mi_assert_internal(heap!=NULL);
  const size_t bin = mi_page_bin(page);
  mi_page_queue_t* pq = &heap->pages[bin];
  mi_assert_internal((mi_page_block_size(page) == pq->block_size) ||
                       (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(pq)) ||
                         (mi_page_is_in_full(page) && mi_page_queue_is_full(pq)));
  return pq;
}